

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

char * fxp_realpath_recv(sftp_packet *pktin,sftp_request *req)

{
  unsigned_long uVar1;
  char *pcVar2;
  ptrlen pl;
  
  safefree(req);
  if (pktin->type == 0x68) {
    uVar1 = BinarySource_get_uint32(pktin->binarysource_);
    if ((pktin->binarysource_[0].err == BSE_NO_ERROR) && (uVar1 == 1)) {
      pl = BinarySource_get_string(pktin->binarysource_);
      if (pktin->binarysource_[0].err == BSE_NO_ERROR) {
        pcVar2 = mkstr(pl);
        goto LAB_001127f3;
      }
      fxp_error_message = "REALPATH returned malformed FXP_NAME\n";
    }
    else {
      fxp_error_message = "REALPATH did not return name count of 1\n";
    }
    fxp_errtype = -1;
  }
  else {
    fxp_got_status(pktin);
  }
  pcVar2 = (char *)0x0;
LAB_001127f3:
  sftp_pkt_free(pktin);
  return pcVar2;
}

Assistant:

char *fxp_realpath_recv(struct sftp_packet *pktin, struct sftp_request *req)
{
    sfree(req);

    if (pktin->type == SSH_FXP_NAME) {
        unsigned long count;
        char *path;
        ptrlen name;

        count = get_uint32(pktin);
        if (get_err(pktin) || count != 1) {
            fxp_internal_error("REALPATH did not return name count of 1\n");
            sftp_pkt_free(pktin);
            return NULL;
        }
        name = get_string(pktin);
        if (get_err(pktin)) {
            fxp_internal_error("REALPATH returned malformed FXP_NAME\n");
            sftp_pkt_free(pktin);
            return NULL;
        }
        path = mkstr(name);
        sftp_pkt_free(pktin);
        return path;
    } else {
        fxp_got_status(pktin);
        sftp_pkt_free(pktin);
        return NULL;
    }
}